

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O2

vector<unsigned_long,_true> * __thiscall
duckdb::FunctionBinder::BindFunctionsFromArguments<duckdb::TableFunction>
          (vector<unsigned_long,_true> *__return_storage_ptr__,FunctionBinder *this,string *name,
          FunctionSet<duckdb::TableFunction> *functions,vector<duckdb::LogicalType,_true> *arguments
          ,ErrorData *error)

{
  pointer pTVar1;
  pointer puVar2;
  long lVar3;
  reference func;
  idx_t iVar4;
  long lVar5;
  long extraout_RDX;
  ulong uVar6;
  pointer pTVar7;
  idx_t local_100;
  BinderException local_f0;
  optional_idx best_function;
  optional_idx bind_cost;
  ErrorData local_b0;
  
  best_function.index = 0xffffffffffffffff;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar6 = 0xffffffffffffffff;
  local_b0._0_8_ = 0;
  local_100 = 0xffffffffffffffff;
  while( true ) {
    pTVar7 = (functions->functions).
             super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
             super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar1 = (functions->functions).
             super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
             super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    lVar3 = (long)pTVar1 - (long)pTVar7;
    lVar5 = lVar3 % 0x1b8;
    if ((ulong)(lVar3 / 0x1b8) <= (ulong)local_b0._0_8_) break;
    func = vector<duckdb::TableFunction,_true>::get<true>(&functions->functions,local_b0._0_8_);
    bind_cost = BindFunctionCost(this,(SimpleFunction *)func,arguments);
    if (bind_cost.index != 0xffffffffffffffff) {
      iVar4 = optional_idx::GetIndex(&bind_cost);
      if (iVar4 == uVar6) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&__return_storage_ptr__->
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                   (value_type_conflict *)&local_b0);
      }
      else if (iVar4 <= uVar6) {
        puVar2 = (__return_storage_ptr__->
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar2) {
          (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar2;
        }
        optional_idx::optional_idx((optional_idx *)&local_f0,local_b0._0_8_);
        local_100 = local_f0.super_Exception._0_8_;
        best_function.index = local_f0.super_Exception._0_8_;
        uVar6 = iVar4;
      }
    }
    local_b0._0_8_ = local_b0._0_8_ + 1;
  }
  if (local_100 == 0xffffffffffffffff) {
    bind_cost.index = 0;
    for (; pTVar7 != pTVar1; pTVar7 = pTVar7 + 1) {
      (*(pTVar7->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
        _vptr_Function[2])(&local_b0,pTVar7,lVar5);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&bind_cost,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_b0);
      lVar5 = extraout_RDX;
    }
    BinderException::NoMatchingFunction
              (&local_f0,name,arguments,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)&bind_cost);
    ErrorData::ErrorData(&local_b0,(exception *)&local_f0);
    ErrorData::operator=(error,&local_b0);
    ErrorData::~ErrorData(&local_b0);
    ::std::runtime_error::~runtime_error((runtime_error *)&local_f0);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&bind_cost);
  }
  else {
    local_b0._0_8_ = optional_idx::GetIndex(&best_function);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
               (unsigned_long *)&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<idx_t> FunctionBinder::BindFunctionsFromArguments(const string &name, FunctionSet<T> &functions,
                                                         const vector<LogicalType> &arguments, ErrorData &error) {
	optional_idx best_function;
	idx_t lowest_cost = NumericLimits<idx_t>::Maximum();
	vector<idx_t> candidate_functions;
	for (idx_t f_idx = 0; f_idx < functions.functions.size(); f_idx++) {
		auto &func = functions.functions[f_idx];
		// check the arguments of the function
		auto bind_cost = BindFunctionCost(func, arguments);
		if (!bind_cost.IsValid()) {
			// auto casting was not possible
			continue;
		}
		auto cost = bind_cost.GetIndex();
		if (cost == lowest_cost) {
			candidate_functions.push_back(f_idx);
			continue;
		}
		if (cost > lowest_cost) {
			continue;
		}
		candidate_functions.clear();
		lowest_cost = cost;
		best_function = f_idx;
	}
	if (!best_function.IsValid()) {
		// no matching function was found, throw an error
		vector<string> candidates;
		for (auto &f : functions.functions) {
			candidates.push_back(f.ToString());
		}
		error = ErrorData(BinderException::NoMatchingFunction(name, arguments, candidates));
		return candidate_functions;
	}
	candidate_functions.push_back(best_function.GetIndex());
	return candidate_functions;
}